

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbrush.cpp
# Opt level: O3

void __thiscall VBrush::VBrush(VBrush *this,VGradient *gradient)

{
  Type TVar1;
  
  this->mType = NoBrush;
  *(uint8_t *)&this->field_1 = '\0';
  *(uint8_t *)((long)&this->field_1 + 1) = '\0';
  *(uint8_t *)((long)&this->field_1 + 2) = '\0';
  *(uint8_t *)((long)&this->field_1 + 3) = '\0';
  if (gradient != (VGradient *)0x0) {
    (this->field_1).mGradient = gradient;
    if (gradient->mType == Linear) {
      TVar1 = LinearGradient;
    }
    else {
      if (gradient->mType != Radial) {
        return;
      }
      TVar1 = RadialGradient;
    }
    this->mType = TVar1;
  }
  return;
}

Assistant:

VBrush::VBrush(const VGradient *gradient)
{
    if (!gradient) return;

    mGradient = gradient;

    if (gradient->mType == VGradient::Type::Linear) {
        mType = VBrush::Type::LinearGradient;
    } else if (gradient->mType == VGradient::Type::Radial) {
        mType = VBrush::Type::RadialGradient;
    }
}